

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O2

void anon_unknown.dwarf_b4f9::fillChannels(Rand48 *random,FlatImage *img)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  FlatImageLevel *pFVar5;
  int y;
  int x;
  
  iVar1 = Imf_3_2::Image::levelMode();
  if (iVar1 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"        level 0");
    std::endl<char,std::char_traits<char>>(poVar4);
    pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img + 0x18))(img,0);
    fillChannels(random,pFVar5);
    return;
  }
  if (iVar1 == 1) {
    iVar1 = 0;
    while( true ) {
      iVar2 = Imf_3_2::Image::numLevels();
      if (iVar2 <= iVar1) break;
      poVar4 = std::operator<<((ostream *)&std::cout,"        level ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      poVar4 = std::operator<<(poVar4,"");
      std::endl<char,std::char_traits<char>>(poVar4);
      pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img + 0x18))(img,iVar1);
      fillChannels(random,pFVar5);
      iVar1 = iVar1 + 1;
    }
  }
  else {
    if (iVar1 != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                    ,0xf1,"void (anonymous namespace)::fillChannels(Rand48 &, FlatImage &)");
    }
    iVar1 = 0;
    while( true ) {
      iVar2 = Imf_3_2::Image::numYLevels();
      if (iVar2 <= iVar1) break;
      iVar2 = 0;
      while( true ) {
        iVar3 = Imf_3_2::Image::numXLevels();
        if (iVar3 <= iVar2) break;
        poVar4 = std::operator<<((ostream *)&std::cout,"        level (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
        poVar4 = std::operator<<(poVar4,")");
        std::endl<char,std::char_traits<char>>(poVar4);
        pFVar5 = (FlatImageLevel *)(**(code **)(*(long *)img + 0x28))(img,iVar2,iVar1);
        fillChannels(random,pFVar5);
        iVar2 = iVar2 + 1;
      }
      iVar1 = iVar1 + 1;
    }
  }
  return;
}

Assistant:

void
fillChannels (Rand48& random, FlatImage& img)
{
    switch (img.levelMode ())
    {
        case ONE_LEVEL:

            cout << "        level 0" << endl;
            fillChannels (random, img.level ());

            break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img.numLevels (); ++x)
            {
                cout << "        level " << x << "" << endl;
                fillChannels (random, img.level (x));
            }

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img.numYLevels (); ++y)
            {
                for (int x = 0; x < img.numXLevels (); ++x)
                {
                    cout << "        level (" << x << ", " << y << ")" << endl;
                    fillChannels (random, img.level (x, y));
                }
            }

            break;

        default: assert (false);
    }
}